

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_sgset(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  PC_DATA *pPVar2;
  long lVar3;
  bool bVar4;
  int gn;
  char *pcVar5;
  CHAR_DATA *ch_00;
  long lVar6;
  double dVar7;
  char arg2 [4608];
  char arg1 [4608];
  char mesg [4608];
  
  pcVar5 = one_argument(argument,arg1);
  one_argument(pcVar5,arg2);
  if ((arg1[0] == '\0') || (arg2[0] == '\0')) {
    pcVar5 = "Syntax:\n\r  set sgroup <name> <group name>\n\r";
  }
  else {
    ch_00 = get_char_world(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "They aren\'t here.\n\r";
    }
    else {
      bVar4 = is_npc(ch_00);
      if (bVar4) {
        pcVar5 = "Not on NPC\'s.\n\r";
      }
      else {
        gn = group_lookup(arg2);
        if (gn == -1) {
          return;
        }
        pPVar2 = ch->pcdata;
        if (pPVar2->group_known[gn] == true) {
          pPVar2->group_known[gn] = false;
          gn_remove(ch_00,gn);
          pcVar5 = "Group removed.\n\r";
        }
        else {
          pPVar2->group_known[gn] = true;
          lVar3 = -0x10;
          do {
            lVar6 = lVar3;
            if (lVar6 + 0x10 == 0x130) goto LAB_002cd6ce;
            bVar4 = str_cmp(arg2,*(char **)((long)&sphere_table[1].name + lVar6));
            lVar3 = lVar6 + 0x10;
          } while (bVar4);
          sprintf(mesg,"%s now has the elemental sphere %s.\n\r",ch_00->name,
                  *(undefined8 *)((long)&sphere_table[1].name + lVar6));
          send_to_char(mesg,ch);
          dVar7 = ldexp(1.0,(int)(*(short *)((long)&sphere_table[1].element + lVar6) % 0x20));
          plVar1 = ch->pcdata->ele_sphere +
                   *(short *)((long)&sphere_table[1].element + lVar6) / 0x20;
          *plVar1 = *plVar1 | (long)dVar7;
LAB_002cd6ce:
          gn_add(ch_00,gn);
          pcVar5 = "Group added.\n\r";
        }
      }
    }
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_sgset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int gn, i;
	char mesg[MSL];

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax:\n\r  set sgroup <name> <group name>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	gn = group_lookup(arg2);

	if (gn != -1)
	{
		if (ch->pcdata->group_known[gn] == true)
		{
			ch->pcdata->group_known[gn] = false;
			gn_remove(victim, gn);
			send_to_char("Group removed.\n\r", ch);
		}
		else
		{
			ch->pcdata->group_known[gn] = true;

			/* Check for sorc focus and adjust accordingly */
			for (i = 0; i < (MAX_ELE); i++)
			{
				if (!str_cmp(arg2, sphere_table[i].name))
				{
					sprintf(mesg, "%s now has the elemental sphere %s.\n\r", victim->name, sphere_table[i].name);
					send_to_char(mesg, ch);

					SET_BIT(ch->pcdata->ele_sphere, sphere_table[i].element);
					break;
				}
			}

			gn_add(victim, gn);
			send_to_char("Group added.\n\r", ch);
		}
	}
}